

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

bool __thiscall ExecutorX86::InitExecution(ExecutorX86 *this)

{
  bool bVar1;
  ExecutorX86 *this_local;
  
  (this->vmState).callStackTop = (this->vmState).callStackBase;
  this->lastFinalReturn = 0;
  CommonSetLinker(this->exLinker);
  (this->vmState).dataStackTop =
       (this->vmState).dataStackBase + (this->exLinker->globalVarSize + 0xf & 0xfffffff0);
  if ((this->vmState).dataStackTop < (this->vmState).dataStackEnd) {
    GC::SetUnmanagableRange
              ((this->vmState).dataStackBase,
               (int)(this->vmState).dataStackEnd - (int)(this->vmState).dataStackBase);
    this->execErrorMessage = (char *)0x0;
    (this->execErrorObject).typeID = 0;
    (this->execErrorObject).ptr = (char *)0x0;
    this->execErrorFinalReturnDepth = 0;
    this->callContinue = true;
    (this->vmState).regFileLastPtr = (this->vmState).regFileArrayBase;
    (this->vmState).regFileLastTop = (this->vmState).regFileArrayBase;
    (this->vmState).instAddress = (this->instAddress).data;
    (this->vmState).codeLaunchHeader = this->codeLaunchHeader;
    bVar1 = FastVector<unsigned_char,_false,_false>::empty(&this->exLinker->fullLinkerData);
    if (!bVar1) {
      nullcModuleStartAddress = (uintptr_t)this->binCode;
      nullcModuleEndAddress = (uintptr_t)(this->binCode + this->binCodeSize);
      nullcJitContextMainDataAddress = (uintptr_t)&(this->vmState).dataStackBase;
    }
    this_local._7_1_ = true;
  }
  else {
    Stop(this,"ERROR: allocated stack overflow");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ExecutorX86::InitExecution()
{
	vmState.callStackTop = vmState.callStackBase;

	lastFinalReturn = 0;

	CommonSetLinker(exLinker);

	vmState.dataStackTop = vmState.dataStackBase + ((exLinker->globalVarSize + 0xf) & ~0xf);

	if(vmState.dataStackTop >= vmState.dataStackEnd)
	{
		Stop("ERROR: allocated stack overflow");
		return false;
	}

	GC::SetUnmanagableRange(vmState.dataStackBase, unsigned(vmState.dataStackEnd - vmState.dataStackBase));

	execErrorMessage = NULL;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;

	execErrorFinalReturnDepth = 0;

	callContinue = true;

	vmState.regFileLastPtr = vmState.regFileArrayBase;
	vmState.regFileLastTop = vmState.regFileArrayBase;

	vmState.instAddress = instAddress.data;
	vmState.codeLaunchHeader = codeLaunchHeader;

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	if(!dcCallVM)
	{
		dcCallVM = dcNewCallVM(4096);
		dcMode(dcCallVM, DC_CALL_C_DEFAULT);
	}
#endif

	if(!exLinker->fullLinkerData.empty())
	{
		nullcModuleStartAddress = uintptr_t(binCode);
		nullcModuleEndAddress = uintptr_t(binCode + binCodeSize);

		nullcJitContextMainDataAddress = uintptr_t(&vmState.dataStackBase);
	}

	return true;
}